

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_version_token(Context *ctx,char *profilestr)

{
  uint uVar1;
  byte maj;
  byte min;
  int iVar2;
  uint8 minor;
  uint8 major;
  uint32 shadertype;
  uint32 token;
  char *profilestr_local;
  Context *ctx_local;
  
  if (ctx->tokencount == 0) {
    fail(ctx,"Expected version token, got none at all.");
    ctx_local._4_4_ = 0;
  }
  else {
    uVar1 = *ctx->tokens;
    maj = (byte)(uVar1 >> 8);
    min = (byte)uVar1;
    ctx->version_token = uVar1;
    if (uVar1 >> 0x10 == 0xffff) {
      ctx->shader_type = MOJOSHADER_TYPE_PIXEL;
      ctx->shader_type_str = "ps";
    }
    else {
      if (uVar1 >> 0x10 != 0xfffe) {
        fail(ctx,"Unsupported shader type or not a shader at all");
        return -1;
      }
      ctx->shader_type = MOJOSHADER_TYPE_VERTEX;
      ctx->shader_type_str = "vs";
    }
    ctx->major_ver = maj;
    ctx->minor_ver = min;
    iVar2 = shader_version_supported(maj,min);
    if (iVar2 == 0) {
      failf(ctx,"Shader Model %u.%u is currently unsupported.",(ulong)maj,(ulong)min);
    }
    iVar2 = isfail(ctx);
    if (iVar2 == 0) {
      (*ctx->profile->start_emitter)(ctx,profilestr);
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_version_token(Context *ctx, const char *profilestr)
{
    if (ctx->tokencount == 0)
    {
        fail(ctx, "Expected version token, got none at all.");
        return 0;
    } // if

    const uint32 token = SWAP32(*(ctx->tokens));
    const uint32 shadertype = ((token >> 16) & 0xFFFF);
    const uint8 major = (uint8) ((token >> 8) & 0xFF);
    const uint8 minor = (uint8) (token & 0xFF);

    ctx->version_token = token;

    // 0xFFFF == pixel shader, 0xFFFE == vertex shader
    if (shadertype == 0xFFFF)
    {
        ctx->shader_type = MOJOSHADER_TYPE_PIXEL;
        ctx->shader_type_str = "ps";
    } // if
    else if (shadertype == 0xFFFE)
    {
        ctx->shader_type = MOJOSHADER_TYPE_VERTEX;
        ctx->shader_type_str = "vs";
    } // else if
    else  // geometry shader? Bogus data?
    {
        fail(ctx, "Unsupported shader type or not a shader at all");
        return -1;
    } // else

    ctx->major_ver = major;
    ctx->minor_ver = minor;

    if (!shader_version_supported(major, minor))
    {
        failf(ctx, "Shader Model %u.%u is currently unsupported.",
                (uint) major, (uint) minor);
    } // if

    if (!isfail(ctx))
        ctx->profile->start_emitter(ctx, profilestr);

    return 1;  // ate one token.
}